

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_file_system.cpp
# Opt level: O2

void __thiscall duckdb::ZstdStreamWrapper::FlushStream(ZstdStreamWrapper *this)

{
  CompressedFile *pCVar1;
  uint uVar2;
  size_t code;
  void *pvVar3;
  pointer pFVar4;
  IOException *this_00;
  char *pcVar5;
  void *pvVar6;
  allocator local_81;
  ZSTD_outBuffer out_buffer;
  string local_68 [32];
  ZSTD_inBuffer local_48;
  
  pCVar1 = this->file;
  local_48.src = (void *)0x0;
  local_48.size = 0;
  local_48.pos = 0;
  pvVar6 = *(void **)(pCVar1 + 0x68);
  pvVar3 = *(void **)(pCVar1 + 0x70);
  do {
    out_buffer.size = (long)pvVar6 + (*(long *)(pCVar1 + 0x98) - (long)pvVar3);
    out_buffer.pos = 0;
    out_buffer.dst = pvVar3;
    code = duckdb_zstd::ZSTD_compressStream2
                     (this->zstd_compress_ptr,&out_buffer,&local_48,ZSTD_e_end);
    uVar2 = duckdb_zstd::ZSTD_isError(code);
    if (uVar2 != 0) {
      this_00 = (IOException *)__cxa_allocate_exception(0x10);
      pcVar5 = duckdb_zstd::ZSTD_getErrorName(code);
      std::__cxx11::string::string(local_68,pcVar5,&local_81);
      duckdb::IOException::IOException(this_00,local_68);
      __cxa_throw(this_00,&IOException::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar3 = (void *)(*(long *)(pCVar1 + 0x70) + out_buffer.pos);
    *(void **)(pCVar1 + 0x70) = pvVar3;
    pvVar6 = *(void **)(pCVar1 + 0x68);
    if (*(void **)(pCVar1 + 0x68) < pvVar3) {
      pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                           *)(this->file + 0x48));
      duckdb::FileHandle::Write(pFVar4,*(ulong *)(pCVar1 + 0x68));
      pvVar3 = *(void **)(pCVar1 + 0x68);
      *(void **)(pCVar1 + 0x70) = pvVar3;
      pvVar6 = pvVar3;
    }
  } while (code != 0);
  return;
}

Assistant:

void ZstdStreamWrapper::FlushStream() {
	auto &sd = file->stream_data;
	duckdb_zstd::ZSTD_inBuffer in_buffer;
	duckdb_zstd::ZSTD_outBuffer out_buffer;

	in_buffer.src = nullptr;
	in_buffer.size = 0;
	in_buffer.pos = 0;
	while (true) {
		idx_t output_remaining = (sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_start;

		out_buffer.dst = sd.out_buff_start;
		out_buffer.size = output_remaining;
		out_buffer.pos = 0;

		auto res =
		    duckdb_zstd::ZSTD_compressStream2(zstd_compress_ptr, &out_buffer, &in_buffer, duckdb_zstd::ZSTD_e_end);
		if (duckdb_zstd::ZSTD_isError(res)) {
			throw IOException(duckdb_zstd::ZSTD_getErrorName(res));
		}
		idx_t written_to_output = out_buffer.pos;
		sd.out_buff_start += written_to_output;
		if (sd.out_buff_start > sd.out_buff.get()) {
			file->child_handle->Write(sd.out_buff.get(), sd.out_buff_start - sd.out_buff.get());
			sd.out_buff_start = sd.out_buff.get();
		}
		if (res == 0) {
			break;
		}
	}
}